

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)

{
  _xmlSchemaAnnot *p_Var1;
  xmlSchemaAnnotPtr pxVar2;
  
  if (facet == (xmlSchemaFacetPtr)0x0) {
    return;
  }
  if (facet->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(facet->val);
  }
  if (facet->regexp != (xmlRegexpPtr)0x0) {
    xmlRegFreeRegexp(facet->regexp);
  }
  pxVar2 = facet->annot;
  if (pxVar2 != (xmlSchemaAnnotPtr)0x0) {
    if (pxVar2->next == (_xmlSchemaAnnot *)0x0) {
      (*xmlFree)(pxVar2);
    }
    else {
      do {
        p_Var1 = pxVar2->next;
        (*xmlFree)(pxVar2);
        pxVar2 = p_Var1;
      } while (p_Var1 != (_xmlSchemaAnnot *)0x0);
    }
  }
  (*xmlFree)(facet);
  return;
}

Assistant:

void
xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)
{
    if (facet == NULL)
        return;
    if (facet->val != NULL)
        xmlSchemaFreeValue(facet->val);
    if (facet->regexp != NULL)
        xmlRegFreeRegexp(facet->regexp);
    if (facet->annot != NULL)
        xmlSchemaFreeAnnot(facet->annot);
    xmlFree(facet);
}